

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::StandardRsCaseItemSyntax::StandardRsCaseItemSyntax
          (StandardRsCaseItemSyntax *this,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *expressions,Token colon,
          RsProdItemSyntax *item,Token semi)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = colon._0_8_;
  (this->super_RsCaseItemSyntax).super_SyntaxNode.kind = StandardRsCaseItem;
  (this->super_RsCaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_RsCaseItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar3 = *(undefined4 *)&(expressions->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (expressions->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.kind =
       (expressions->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->expressions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (expressions->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (this->expressions).super_SyntaxListBase.childCount =
       (expressions->super_SyntaxListBase).childCount;
  (this->expressions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d57b8;
  sVar2 = (expressions->elements)._M_extent._M_extent_value;
  (this->expressions).elements._M_ptr = (expressions->elements)._M_ptr;
  (this->expressions).elements._M_extent._M_extent_value = sVar2;
  (this->colon).kind = (short)uVar5;
  (this->colon).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->colon).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->colon).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->colon).info = colon.info;
  (this->item).ptr = item;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->expressions).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  uVar6 = (this->expressions).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->expressions).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar4)->parent = (SyntaxNode *)this;
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  (((this->item).ptr)->super_RsProdSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

StandardRsCaseItemSyntax(const SeparatedSyntaxList<ExpressionSyntax>& expressions, Token colon, RsProdItemSyntax& item, Token semi) :
        RsCaseItemSyntax(SyntaxKind::StandardRsCaseItem), expressions(expressions), colon(colon), item(&item), semi(semi) {
        this->expressions.parent = this;
        for (auto child : this->expressions)
            child->parent = this;
        this->item->parent = this;
    }